

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O0

void __thiscall
iu_AssertionTest_x_iutest_x_STRIN_Test::iu_AssertionTest_x_iutest_x_STRIN_Test
          (iu_AssertionTest_x_iutest_x_STRIN_Test *this)

{
  iu_AssertionTest_x_iutest_x_STRIN_Test *this_local;
  
  iutest::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__iu_AssertionTest_x_iutest_x_STRIN_Test_00238038;
  return;
}

Assistant:

IUTEST(AssertionTest, STRIN)
{
    const char test[] = "test";
    ::std::string str = test;
    IUTEST_ASSERT_STRIN("tes", test);
    IUTEST_EXPECT_STRIN("tes", test);
    IUTEST_INFORM_STRIN("tes", test);
    IUTEST_ASSUME_STRIN("tes", test);

    IUTEST_ASSERT_STRIN("test", test);
    IUTEST_EXPECT_STRIN("test", test);
    IUTEST_INFORM_STRIN("test", test);
    IUTEST_ASSUME_STRIN("test", test);

    IUTEST_ASSERT_STRIN("tes", str);
    IUTEST_EXPECT_STRIN("tes", str);
    IUTEST_INFORM_STRIN("tes", str);
    IUTEST_ASSUME_STRIN("tes", str);
}